

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void response_close_frame_written
               (cio_buffered_stream *buffered_stream,void *handler_context,cio_error err)

{
  cio_websocket *websocket;
  cio_error err_local;
  void *handler_context_local;
  cio_buffered_stream *buffered_stream_local;
  
  write_jobs_popfront((cio_websocket *)handler_context);
  abort_write_jobs((cio_websocket *)handler_context);
  close((int)handler_context);
  return;
}

Assistant:

static void response_close_frame_written(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	(void)err;

	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	write_jobs_popfront(websocket);

	abort_write_jobs(websocket);
	close(websocket);
}